

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_view.cpp
# Opt level: O3

unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true> __thiscall
duckdb::Transformer::TransformCreateView(Transformer *this,PGViewStmt *stmt)

{
  char cVar1;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var2;
  long lVar3;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var4;
  undefined1 auVar5 [8];
  undefined8 uVar6;
  bool bVar7;
  OnCreateConflict OVar8;
  Transformer *pTVar9;
  __uniq_ptr_impl<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>_> this_00;
  pointer pCVar10;
  pointer pCVar11;
  NotImplementedException *pNVar12;
  ParserException *this_01;
  long in_RDX;
  long *plVar13;
  optional_ptr<duckdb_libpgquery::PGValue,_true> val;
  QualifiedName qname;
  undefined1 local_c0 [8];
  undefined1 local_b8 [32];
  __node_base local_98;
  undefined1 local_90 [32];
  _Alloc_hider local_70;
  char local_60 [16];
  __node_base local_50;
  _Hash_node_base local_40 [2];
  
  pTVar9 = (Transformer *)operator_new(0x80);
  CreateStatement::CreateStatement((CreateStatement *)pTVar9);
  (this->parent).ptr = pTVar9;
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>.
  super__Head_base<0UL,_duckdb::CreateViewInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>)
       operator_new(0x1b0);
  CreateViewInfo::CreateViewInfo
            ((CreateViewInfo *)
             this_00._M_t.
             super__Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>
             .super__Head_base<0UL,_duckdb::CreateViewInfo_*,_false>._M_head_impl);
  local_c0 = (undefined1  [8])
             this_00._M_t.
             super__Tuple_impl<0UL,_duckdb::CreateViewInfo_*,_std::default_delete<duckdb::CreateViewInfo>_>
             .super__Head_base<0UL,_duckdb::CreateViewInfo_*,_false>._M_head_impl;
  TransformQualifiedName((QualifiedName *)local_90,(Transformer *)stmt,*(PGRangeVar **)(in_RDX + 8))
  ;
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar10->super_CreateInfo).catalog);
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  ::std::__cxx11::string::_M_assign((string *)&(pCVar10->super_CreateInfo).schema);
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  ::std::__cxx11::string::_M_assign((string *)&pCVar10->view_name);
  cVar1 = *(char *)(*(long *)(in_RDX + 8) + 0x21);
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  (pCVar10->super_CreateInfo).temporary = cVar1 == '\0';
  pTVar9 = (Transformer *)local_c0;
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)pTVar9);
  if ((pCVar10->super_CreateInfo).temporary == true) {
    pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                            *)local_c0);
    pTVar9 = (Transformer *)&(pCVar10->super_CreateInfo).catalog;
    bVar7 = IsInvalidCatalog((string *)pTVar9);
    if (bVar7) {
      pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                              *)local_c0);
      pTVar9 = (Transformer *)&(pCVar10->super_CreateInfo).catalog;
      ::std::__cxx11::string::_M_replace
                ((ulong)pTVar9,0,(char *)(pCVar10->super_CreateInfo).catalog._M_string_length,
                 0x1323bb4);
    }
  }
  OVar8 = TransformOnConflict(pTVar9,*(PGOnCreateConflict *)(in_RDX + 0x20));
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  (pCVar10->super_CreateInfo).on_conflict = OVar8;
  TransformSelectStmt((Transformer *)local_b8,(PGNode *)stmt,SUB81(*(undefined8 *)(in_RDX + 0x18),0)
                     );
  pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                        *)local_c0);
  uVar6 = local_b8._0_8_;
  local_b8._0_8_ = (Transformer *)0x0;
  _Var2._M_head_impl =
       (pCVar10->query).
       super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
       .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
  (pCVar10->query).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)uVar6;
  if (_Var2._M_head_impl != (SelectStatement *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_SQLStatement + 8))();
    if ((Transformer *)local_b8._0_8_ != (Transformer *)0x0) {
      (**(code **)(*(long *)local_b8._0_8_ + 8))();
    }
  }
  local_b8._0_8_ = (Transformer *)(local_b8 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"view","");
  PivotEntryCheck((Transformer *)stmt,(string *)local_b8);
  if ((Transformer *)local_b8._0_8_ != (Transformer *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_);
  }
  lVar3 = *(long *)(in_RDX + 0x10);
  if ((lVar3 != 0) && (0 < *(int *)(lVar3 + 4))) {
    plVar13 = *(long **)(lVar3 + 8);
    if (plVar13 != (long *)0x0) {
      do {
        local_98._M_nxt = (_Hash_node_base *)*plVar13;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_98);
        if (*(int *)&(local_98._M_nxt)->_M_nxt != 0xdb) {
          pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_b8._0_8_ = local_b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,"View projection type","");
          NotImplementedException::NotImplementedException(pNVar12,(string *)local_b8);
          __cxa_throw(pNVar12,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                  ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                                *)local_c0);
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)&local_98);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char*&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &pCVar10->aliases,(char **)(local_98._M_nxt + 1));
        plVar13 = (long *)plVar13[1];
      } while (plVar13 != (long *)0x0);
    }
    pCVar10 = unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
              ::operator->((unique_ptr<duckdb::CreateViewInfo,_std::default_delete<duckdb::CreateViewInfo>,_true>
                            *)local_c0);
    if ((pCVar10->aliases).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (pCVar10->aliases).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (ParserException *)__cxa_allocate_exception(0x10);
      local_b8._0_8_ = (Transformer *)(local_b8 + 0x10);
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"Need at least one column name in CREATE VIEW projection list",
                 "");
      ParserException::ParserException(this_01,(string *)local_b8);
      __cxa_throw(this_01,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
  }
  auVar5 = local_c0;
  if ((*(long *)(in_RDX + 0x28) != 0) && (0 < *(int *)(*(long *)(in_RDX + 0x28) + 4))) {
    pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_b8._0_8_ = (Transformer *)(local_b8 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"VIEW options","");
    NotImplementedException::NotImplementedException(pNVar12,(string *)local_b8);
    __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (*(int *)(in_RDX + 0x30) == 0) {
    local_c0 = (undefined1  [8])0x0;
    pCVar11 = unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
              ::operator->((unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>,_true>
                            *)this);
    _Var4._M_head_impl =
         (pCVar11->info).
         super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (pCVar11->info).super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
    _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)auVar5;
    if (_Var4._M_head_impl != (CreateInfo *)0x0) {
      (**(code **)(*(long *)&(_Var4._M_head_impl)->super_ParseInfo + 8))();
    }
    if (local_50._M_nxt != local_40) {
      operator_delete(local_50._M_nxt);
    }
    if (local_70._M_p != local_60) {
      operator_delete(local_70._M_p);
    }
    if ((_Hash_node_base *)local_90._0_8_ != (_Hash_node_base *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_);
    }
    if (local_c0 != (undefined1  [8])0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_c0)->ptr->options)();
    }
    return (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)
           (unique_ptr<duckdb::CreateStatement,_std::default_delete<duckdb::CreateStatement>_>)this;
  }
  pNVar12 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  local_b8._0_8_ = (Transformer *)(local_b8 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"VIEW CHECK options","");
  NotImplementedException::NotImplementedException(pNVar12,(string *)local_b8);
  __cxa_throw(pNVar12,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<CreateStatement> Transformer::TransformCreateView(duckdb_libpgquery::PGViewStmt &stmt) {
	D_ASSERT(stmt.type == duckdb_libpgquery::T_PGViewStmt);
	D_ASSERT(stmt.view);

	auto result = make_uniq<CreateStatement>();
	auto info = make_uniq<CreateViewInfo>();

	auto qname = TransformQualifiedName(*stmt.view);
	info->catalog = qname.catalog;
	info->schema = qname.schema;
	info->view_name = qname.name;
	info->temporary = !stmt.view->relpersistence;
	if (info->temporary && IsInvalidCatalog(info->catalog)) {
		info->catalog = TEMP_CATALOG;
	}
	info->on_conflict = TransformOnConflict(stmt.onconflict);

	info->query = TransformSelectStmt(*stmt.query, false);

	PivotEntryCheck("view");

	if (stmt.aliases && stmt.aliases->length > 0) {
		for (auto c = stmt.aliases->head; c != nullptr; c = lnext(c)) {
			auto val = PGPointerCast<duckdb_libpgquery::PGValue>(c->data.ptr_value);
			switch (val->type) {
			case duckdb_libpgquery::T_PGString: {
				info->aliases.emplace_back(val->val.str);
				break;
			}
			default:
				throw NotImplementedException("View projection type");
			}
		}
		if (info->aliases.empty()) {
			throw ParserException("Need at least one column name in CREATE VIEW projection list");
		}
	}

	if (stmt.options && stmt.options->length > 0) {
		throw NotImplementedException("VIEW options");
	}

	if (stmt.withCheckOption != duckdb_libpgquery::PGViewCheckOption::PG_NO_CHECK_OPTION) {
		throw NotImplementedException("VIEW CHECK options");
	}
	result->info = std::move(info);
	return result;
}